

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O0

void __thiscall
agge::tests::RendererTests::RendererPopulatesBitmapWithMaskDataAccordinglyToOffsetAndWindow
          (RendererTests *this)

{
  cell *pcVar1;
  cell *pcVar2;
  allocator local_1e1;
  string local_1e0 [32];
  LocationInfo local_1c0;
  uchar auStack_198 [8];
  uint8_t reference1 [42];
  simple_alpha<unsigned_char,_8UL> local_161;
  agge_vector<int> local_160;
  undefined1 auStack_158 [8];
  rect_i window1;
  renderer r;
  blender<unsigned_char,_unsigned_char> blender;
  undefined1 local_110 [8];
  bitmap<unsigned_char,_1UL,_0UL> bitmap;
  mask_full<8UL> mask;
  scanline_cells cells1 [4];
  cell cells14 [2];
  undefined1 auStack_68 [8];
  cell cells13 [2];
  undefined1 auStack_48 [8];
  cell cells12 [2];
  undefined1 auStack_28 [8];
  cell cells11 [2];
  RendererTests *this_local;
  
  cells11[0].cover = 0;
  cells11[1].x = -0x11;
  auStack_28._0_4_ = 0;
  auStack_28._4_4_ = 0;
  cells11[0].x = 0x11;
  cells11[0].area = 4;
  cells12[0].cover = 0;
  cells12[1].x = -0xab;
  auStack_48._0_4_ = 1;
  auStack_48._4_4_ = 0;
  cells12[0].x = 0xab;
  cells12[0].area = 5;
  cells13[0].cover = 0;
  cells13[1].x = -0xa0;
  auStack_68._0_4_ = 2;
  auStack_68._4_4_ = 0;
  cells13[0].x = 0xa0;
  cells13[0].area = 6;
  cells1[3].second = (cell *)0x3;
  cells11[1]._4_8_ = this;
  pcVar1 = begin<agge::tests::mocks::cell_const,2ul>((cell (*) [2])auStack_28);
  pcVar2 = end<agge::tests::mocks::cell_const,2ul>((cell (*) [2])auStack_28);
  join_0x00000010_0x00000000_ =
       std::make_pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>
                 (pcVar1,pcVar2);
  pcVar1 = begin<agge::tests::mocks::cell_const,2ul>((cell (*) [2])auStack_48);
  pcVar2 = end<agge::tests::mocks::cell_const,2ul>((cell (*) [2])auStack_48);
  cells1._8_16_ =
       (undefined1  [16])
       std::make_pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>
                 (pcVar1,pcVar2);
  pcVar1 = begin<agge::tests::mocks::cell_const,2ul>((cell (*) [2])auStack_68);
  pcVar2 = end<agge::tests::mocks::cell_const,2ul>((cell (*) [2])auStack_68);
  cells1._24_16_ =
       (undefined1  [16])
       std::make_pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>
                 (pcVar1,pcVar2);
  pcVar1 = begin<agge::tests::mocks::cell_const,2ul>((cell (*) [2])&cells1[3].second);
  pcVar2 = end<agge::tests::mocks::cell_const,2ul>((cell (*) [2])&cells1[3].second);
  cells1._40_16_ =
       (undefined1  [16])
       std::make_pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>
                 (pcVar1,pcVar2);
  tests::mocks::mask_full<8ul>::
  mask_full<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,4>
            ((mask_full<8ul> *)&bitmap._width,
             (pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*> (*) [4])
             &mask.super_mask<8UL>._cells.
              super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  tests::mocks::bitmap<unsigned_char,_1UL,_0UL>::bitmap
            ((bitmap<unsigned_char,_1UL,_0UL> *)local_110,6,6);
  tests::mocks::blender<unsigned_char,_unsigned_char>::blender
            ((blender<unsigned_char,_unsigned_char> *)&r._scanline_cache._size);
  renderer::renderer((renderer *)&window1.x2);
  auStack_158._0_4_ = 2;
  auStack_158._4_4_ = 1;
  window1.x1 = 5;
  window1.y1 = 3;
  local_160 = mkvector<int>(1,1);
  renderer::operator()
            ((renderer *)&window1.x2,(bitmap<unsigned_char,_1UL,_0UL> *)local_110,local_160,
             (rect_i *)auStack_158,(mask_full<8UL> *)&bitmap._width,
             (blender<unsigned_char,_unsigned_char> *)&r._scanline_cache._size,&local_161);
  reference1[0x18] = '\0';
  reference1[0x19] = '\0';
  reference1[0x1a] = '\0';
  reference1[0x1b] = '\0';
  reference1[0x1c] = '\0';
  reference1[0x1d] = '\0';
  reference1[0x1e] = '\0';
  reference1[0x1f] = '\0';
  reference1[0x20] = '\0';
  reference1[0x21] = '\0';
  reference1[8] = '\0';
  reference1[9] = '\0';
  reference1[10] = '\0';
  reference1[0xb] = '\0';
  reference1[0xc] = '\0';
  reference1[0xd] = '\0';
  reference1[0xe] = '\0';
  reference1[0xf] = '\0';
  reference1[0x10] = '\0';
  reference1[0x11] = '\0';
  reference1[0x12] = '\0';
  reference1[0x13] = '\0';
  reference1[0x14] = '\0';
  reference1[0x15] = '\0';
  reference1[0x16] = '\0';
  reference1[0x17] = '\0';
  auStack_198[0] = '\0';
  auStack_198[1] = 0xab;
  auStack_198[2] = 0xab;
  auStack_198[3] = 0xab;
  auStack_198[4] = '\0';
  auStack_198[5] = '\0';
  auStack_198[6] = '\0';
  auStack_198[7] = '\0';
  reference1[0] = 0xa0;
  reference1[1] = 0xa0;
  reference1[2] = 0xa0;
  reference1[3] = '\0';
  reference1[4] = '\0';
  reference1[5] = '\0';
  reference1[6] = '\0';
  reference1[7] = '\0';
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1e0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
             ,&local_1e1);
  ut::LocationInfo::LocationInfo(&local_1c0,(string *)local_1e0,0x4b2);
  ut::are_equal<unsigned_char,42ul,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((uchar (*) [42])auStack_198,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_110,&local_1c0);
  ut::LocationInfo::~LocationInfo(&local_1c0);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  renderer::~renderer((renderer *)&window1.x2);
  tests::mocks::blender<unsigned_char,_unsigned_char>::~blender
            ((blender<unsigned_char,_unsigned_char> *)&r._scanline_cache._size);
  tests::mocks::bitmap<unsigned_char,_1UL,_0UL>::~bitmap
            ((bitmap<unsigned_char,_1UL,_0UL> *)local_110);
  tests::mocks::mask_full<8UL>::~mask_full((mask_full<8UL> *)&bitmap._width);
  return;
}

Assistant:

test( RendererPopulatesBitmapWithMaskDataAccordinglyToOffsetAndWindow )
			{
				// INIT
				const mocks::cell cells11[] = { { 0, 0, 0x11 }, { 4, 0, -0x11 }, };
				const mocks::cell cells12[] = { { 1, 0, 0xAB }, { 5, 0, -0xAB }, };
				const mocks::cell cells13[] = { { 2, 0, 0xA0 }, { 6, 0, -0xA0 }, };
				const mocks::cell cells14[] = { { 3, 0, 0xC0 }, { 7, 0, -0xC0 }, };
				const mocks::mask<8>::scanline_cells cells1[] = {
					make_pair(begin(cells11), end(cells11)),
					make_pair(begin(cells12), end(cells12)),
					make_pair(begin(cells13), end(cells13)),
					make_pair(begin(cells14), end(cells14)),
				};
				const mocks::mask_full<8> mask(cells1, 0);
				mocks::bitmap<uint8_t, 1> bitmap(6, 6);
				mocks::blender<uint8_t, uint8_t> blender;
				renderer r;

				// ACT
				rect_i window1 = { 2, 1, 5, 3 };
				r(bitmap, mkvector(1, 1), &window1, mask, blender, mocks::simple_alpha<uint8_t, 8>());

				// ASSERT
				uint8_t reference1[] = {
					0x00, 0xAB, 0xAB, 0xAB, 0x00, 0x00, 0x00,
					0x00, 0xA0, 0xA0, 0xA0, 0x00, 0x00, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
					0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
				};

				assert_equal(reference1, bitmap.data);
			}